

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length)

{
  (this->data_).n = (Number)0x0;
  (this->data_).s.str = (Ch *)0x0;
  if (length == 0 || s != (Ch *)0x0) {
    if (s == (Ch *)0x0) {
      s = "";
    }
    (this->data_).s.str = (Ch *)((ulong)s | 0x405000000000000);
    (this->data_).s.length = length;
    return;
  }
  __assert_fail("str != 0 || len == 0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x19c,
                "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
               );
}

Assistant:

GenericValue(const Ch* s, SizeType length) RAPIDJSON_NOEXCEPT : data_() { SetStringRaw(StringRef(s, length)); }